

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall sf::String::String(String *this,wchar_t wideChar)

{
  Uint32 __c;
  wchar_t wideChar_local;
  String *this_local;
  
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(&this->m_string);
  __c = Utf<32U>::decodeWide<wchar_t>(wideChar);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  operator+=(&this->m_string,__c);
  return;
}

Assistant:

String::String(wchar_t wideChar)
{
    m_string += Utf32::decodeWide(wideChar);
}